

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

bool __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>
::IfConsiderConversion
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>
           *this)

{
  ConstraintAcceptanceLevel CVar1;
  ExpressionAcceptanceLevel EVar2;
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  bool bVar4;
  
  CVar1 = BasicConstraintKeeper::GetChosenAcceptanceLevel(&this->super_BasicConstraintKeeper);
  if (CVar1 == NotAccepted) {
    bVar4 = true;
  }
  else {
    pFVar3 = this->cvt_;
    if ((pFVar3->
        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ).options_.accExpr_ == 1) {
      EVar2 = BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR
                        (&this->super_BasicConstraintKeeper);
      if (EVar2 != NotAccepted) {
        return false;
      }
      pFVar3 = this->cvt_;
    }
    bVar4 = (pFVar3->
            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).options_.accAll_ != 2;
  }
  return bVar4;
}

Assistant:

bool IfConsiderConversion() const {
    return
        (ConstraintAcceptanceLevel::NotAccepted == GetChosenAcceptanceLevel()
         || (ConstraintAcceptanceLevel::NotAccepted == GetModelAPIAcceptance()
             && (!GetConverter().IfWantNLOutput()
                 || ExpressionAcceptanceLevel::NotAccepted
                        == GetChosenAcceptanceLevelEXPR())
                && 2 != AccLevelCommon()));             // Not when acc:_all=2
  }